

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::initPh2RowBound(HModel *this,int firstrow,int lastrow)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  int row;
  long lVar7;
  double dVar8;
  
  lVar6 = (long)this->numCol;
  pdVar1 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar7 = (long)firstrow; lVar7 <= lastrow; lVar7 = lVar7 + 1) {
    pdVar3[lVar6 + lVar7] = -pdVar2[lVar7];
    dVar8 = -pdVar1[lVar7];
    pdVar4[lVar6 + lVar7] = dVar8;
    pdVar5[lVar6 + lVar7] = dVar8 - pdVar3[lVar6 + lVar7];
  }
  return;
}

Assistant:

void HModel::initPh2RowBound(int firstrow, int lastrow) {
  // Copy bounds and compute ranges
  assert(firstrow >= 0);
  assert(lastrow < numRow);
  for (int row = firstrow; row <= lastrow; row++) {
    int var = numCol+row;
    workLower[var] = -rowUpper[row];
    workUpper[var] = -rowLower[row];
    workRange[var] = workUpper[var] - workLower[var];
  }
}